

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

void lyxp_vars_free(lyxp_var *vars)

{
  char **ppcVar1;
  char *pcVar2;
  
  if (vars != (lyxp_var *)0x0) {
    if (vars[-1].value != (char *)0x0) {
      ppcVar1 = &vars->value;
      pcVar2 = (char *)0x0;
      do {
        free(((lyxp_var *)(ppcVar1 + -1))->name);
        free(*ppcVar1);
        pcVar2 = pcVar2 + 1;
        ppcVar1 = ppcVar1 + 2;
      } while (pcVar2 < vars[-1].value);
    }
    free(&vars[-1].value);
    return;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyxp_vars_free(struct lyxp_var *vars)
{
    LY_ARRAY_COUNT_TYPE u;

    if (!vars) {
        return;
    }

    LY_ARRAY_FOR(vars, u) {
        free(vars[u].name);
        free(vars[u].value);
    }

    LY_ARRAY_FREE(vars);
}